

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTokenizer.cpp
# Opt level: O0

void __thiscall SimpleStringTokenizer::SkipTillToken(SimpleStringTokenizer *this)

{
  bool bVar1;
  uint uVar2;
  EStatusCode EVar3;
  Byte local_11;
  SimpleStringTokenizer *pSStack_10;
  Byte buffer;
  SimpleStringTokenizer *this_local;
  
  local_11 = '\0';
  pSStack_10 = this;
  if (this->mStream != (IByteReader *)0x0) {
    do {
      uVar2 = (*this->mStream->_vptr_IByteReader[3])();
      if ((uVar2 & 1) == 0) {
        return;
      }
      EVar3 = GetNextByteForToken(this,&local_11);
      if (EVar3 != eSuccess) {
        return;
      }
      bVar1 = IsPDFWhiteSpace(this,local_11);
    } while (bVar1);
    SaveTokenBuffer(this,local_11);
  }
  return;
}

Assistant:

void SimpleStringTokenizer::SkipTillToken()
{
	Byte buffer = 0;

	if(!mStream)
		return;

	// skip till hitting first non space, or segment end
	while(mStream->NotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPDFWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}